

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalTranslator.cpp
# Opt level: O0

void __thiscall UnitTest::SignalTranslator::~SignalTranslator(SignalTranslator *this)

{
  SignalTranslator *this_local;
  
  sigaction(4,(sigaction *)&this->m_old_SIGBUS_action,(sigaction *)0x0);
  sigaction(7,(sigaction *)&this->m_old_SIGBUS_action,(sigaction *)0x0);
  sigaction(5,(sigaction *)&this->m_old_SIGTRAP_action,(sigaction *)0x0);
  sigaction(8,(sigaction *)&this->m_old_SIGFPE_action,(sigaction *)0x0);
  sigaction(0xb,(sigaction *)&this->m_old_SIGSEGV_action,(sigaction *)0x0);
  s_jumpTarget = this->m_oldJumpTarget;
  return;
}

Assistant:

SignalTranslator::~SignalTranslator()
{
    sigaction( SIGILL , &m_old_SIGBUS_action , 0 );
    sigaction( SIGBUS , &m_old_SIGBUS_action , 0 );
    sigaction( SIGTRAP, &m_old_SIGTRAP_action, 0 );
    sigaction( SIGFPE , &m_old_SIGFPE_action , 0 );
    sigaction( SIGSEGV, &m_old_SIGSEGV_action, 0 );

    s_jumpTarget = m_oldJumpTarget;
}